

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O2

void __thiscall Runner::run(Runner *this)

{
  pointer pcVar1;
  ScheduleHandle schedule;
  int count;
  Optimizer optimizer;
  ScheduleHandle local_68;
  uint local_54;
  Optimizer local_50;
  undefined1 *local_48;
  string local_40;
  
  local_68.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_68.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Schedule::fromFile((pair<std::shared_ptr<Schedule>,_int> *)&local_40,&this->input);
  local_50.limit = (size_t)&local_54;
  local_48 = (undefined1 *)&local_68;
  std::tuple<std::shared_ptr<Schedule>&,int&>::operator=
            ((tuple<std::shared_ptr<Schedule>&,int&> *)&local_50,
             (pair<std::shared_ptr<Schedule>,_int> *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
  local_50.limit = this->limit;
  pcVar1 = (this->input)._M_dataplus._M_p;
  Optimizer::name_abi_cxx11_(&local_40,&local_50);
  printf("Running case %s (%d operators) with %s ... \n",pcVar1,(ulong)local_54,
         local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  Optimizer::optimize(&local_50,&local_68,&this->output);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_68.super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void run() {
        ScheduleHandle schedule;
        int count;
        std::tie(schedule, count) = Schedule::fromFile(input);
        auto optimizer = Optimizer(limit);
        printf("Running case %s (%d operators) with %s ... \n", input.c_str(), count, optimizer.name().c_str());
        optimizer.optimize(schedule, output);
    }